

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O0

void discover_object(int oindx,boolean mark_as_known,boolean credit_hero)

{
  int local_14;
  int acls;
  int dindx;
  boolean credit_hero_local;
  boolean mark_as_known_local;
  int oindx_local;
  
  if ((objects[oindx].field_0x10 & 1) == 0) {
    local_14 = bases[(int)objects[oindx].oc_class];
    while ((disco[local_14] != 0 && (disco[local_14] != oindx))) {
      local_14 = local_14 + 1;
    }
    disco[local_14] = (short)oindx;
    if (mark_as_known != '\0') {
      objects[oindx].field_0x10 = objects[oindx].field_0x10 & 0xfe | 1;
      if (credit_hero != '\0') {
        exercise(2,'\x01');
      }
      if ((oindx < 0x5f) || (0x69 < oindx)) {
        if ((0x53 < oindx) && (oindx < 0x5f)) {
          discover_object(oindx + 0xb,mark_as_known,'\0');
        }
      }
      else {
        discover_object(oindx + -0xb,mark_as_known,'\0');
      }
    }
    if (1 < moves) {
      update_inventory();
    }
  }
  return;
}

Assistant:

void discover_object(int oindx, boolean mark_as_known, boolean credit_hero)
{
    if (!objects[oindx].oc_name_known) {
	int dindx, acls = objects[oindx].oc_class;

	/* Loop thru disco[] 'til we find the target (which may have been
	   uname'd) or the next open slot; one or the other will be found
	   before we reach the next class...
	 */
	for (dindx = bases[acls]; disco[dindx] != 0; dindx++)
	    if (disco[dindx] == oindx) break;
	disco[dindx] = oindx;

	if (mark_as_known) {
	    objects[oindx].oc_name_known = 1;
	    if (credit_hero) exercise(A_WIS, TRUE);

	    if (Is_dragon_scales(oindx))
		discover_object(Dragon_scales_to_mail(oindx), mark_as_known, FALSE);
	    else if (Is_dragon_mail(oindx))
		discover_object(Dragon_mail_to_scales(oindx), mark_as_known, FALSE);
	}
	if (moves > 1L) update_inventory();
    }
}